

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

fdb_status fdb_close(fdb_file_handle *fhandle)

{
  wal_dirty_t wVar1;
  fdb_status fVar2;
  size_t sVar3;
  filemgr *in_RDI;
  fdb_status fs;
  void *in_stack_00000018;
  filemgr *in_stack_00000020;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  fdb_status local_4;
  
  if (in_RDI == (filemgr *)0x0) {
    local_4 = FDB_RESULT_INVALID_HANDLE;
  }
  else {
    if ((((in_RDI->filename[0x89] & 1U) != 0) && (sVar3 = filemgr_get_ref_count(in_RDI), sVar3 == 1)
        ) && (wVar1 = wal_get_dirty_status(in_RDI), wVar1 == '\x01')) {
      fVar2 = fdb_commit((fdb_file_handle *)
                         CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),'\0');
      if (fVar2 != FDB_RESULT_SUCCESS) {
        return fVar2;
      }
      in_stack_ffffffffffffffec = 0;
    }
    filemgr_fhandle_remove(in_stack_00000020,in_stack_00000018);
    local_4 = _fdb_close_root((fdb_kvs_handle *)
                              CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
    if (local_4 == FDB_RESULT_SUCCESS) {
      fdb_file_handle_close_all((fdb_file_handle *)in_RDI);
      fdb_file_handle_free((fdb_file_handle *)0x146a79);
    }
    else {
      filemgr_fhandle_add(in_stack_00000020,in_stack_00000018);
    }
  }
  return local_4;
}

Assistant:

fdb_status _fdb_close(fdb_kvs_handle *handle)
{
    fdb_status fs;
    if (!(handle->config.flags & FDB_OPEN_FLAG_RDONLY)) {
        if (handle->config.compaction_mode == FDB_COMPACTION_AUTO) {
            // read-only file is not registered in compactor
            compactor_deregister_file(handle->file);
        }
        bgflusher_deregister_file(handle->file);
    }

    btreeblk_end(handle->bhandle);
    btreeblk_free(handle->bhandle);

    if (handle->shandle) { // must close wal_snapshot before file
        wal_snapshot_close(handle->shandle, handle->file);
        filemgr_dirty_update_close_node(handle->file,
            btreeblk_get_dirty_update(handle->bhandle));
        btreeblk_clear_dirty_update(handle->bhandle);
    }

    fs = filemgr_close(handle->file, handle->config.cleanup_cache_onclose,
                                  handle->filename, &handle->log_callback);
    if (fs != FDB_RESULT_SUCCESS) {
        return fs;
    }
    docio_free(handle->dhandle);
    hbtrie_free(handle->trie);
    free(handle->trie);

    if (handle->config.seqtree_opt == FDB_SEQTREE_USE) {
        if (handle->kvs) {
            // multi KV instance mode
            hbtrie_free(handle->seqtrie);
            free(handle->seqtrie);
        } else {
            free(handle->seqtree->kv_ops);
            free(handle->seqtree);
        }
    }

    if (handle->staletree) {
        free(handle->staletree->kv_ops);
        free(handle->staletree);
    }

    free(handle->bhandle);
    free(handle->dhandle);
    if (handle->filename) {
        free(handle->filename);
        handle->filename = NULL;
    }

    _destroy_bottom_up_build_entries(handle);

    return fs;
}